

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

AlexNode<int,_int> * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::NodeIterator::
next(NodeIterator *this)

{
  stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
  *this_00;
  iterator *piVar1;
  AlexNode<int,_int> **__args;
  double dVar2;
  AlexNode<int,_int> *pAVar3;
  bool bVar4;
  _Elt_pointer ppAVar5;
  AlexNode<int,_int> *pAVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  ppAVar5 = (this->node_stack_).c.
            super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar5 ==
      (this->node_stack_).c.
      super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    this->cur_node_ = (AlexNode<int,_int> *)0x0;
    pAVar6 = (AlexNode<int,_int> *)0x0;
  }
  else {
    this_00 = &this->node_stack_;
    if (ppAVar5 ==
        (this->node_stack_).c.
        super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppAVar5 = (this->node_stack_).c.
                super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->cur_node_ = ppAVar5[-1];
    std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::pop_back
              (&this_00->c);
    pAVar6 = this->cur_node_;
    if (pAVar6->is_leaf_ == false) {
      iVar7._0_1_ = pAVar6[1].is_leaf_;
      iVar7._1_1_ = pAVar6[1].duplication_factor_;
      iVar7._2_2_ = pAVar6[1].level_;
      __args = (AlexNode<int,_int> **)((long)pAVar6[1].model_.a_ + -8 + (long)iVar7 * 8);
      ppAVar5 = (this->node_stack_).c.
                super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppAVar5 ==
          (this->node_stack_).c.
          super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
        _M_push_back_aux<alex::AlexNode<int,int>*const&>
                  ((deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)
                   this_00,__args);
        iVar7._0_1_ = pAVar6[1].is_leaf_;
        iVar7._1_1_ = pAVar6[1].duplication_factor_;
        iVar7._2_2_ = pAVar6[1].level_;
      }
      else {
        *ppAVar5 = *__args;
        piVar1 = &(this->node_stack_).c.
                  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      if (1 < iVar7) {
        lVar8 = (ulong)(iVar7 - 2) << 3;
        lVar9 = (ulong)(iVar7 - 2) + 1;
        do {
          dVar2 = pAVar6[1].model_.a_;
          pAVar3 = *(AlexNode<int,_int> **)((long)dVar2 + -8 + lVar9 * 8);
          if (pAVar3 != *(AlexNode<int,_int> **)((long)dVar2 + lVar9 * 8)) {
            ppAVar5 = (this->node_stack_).c.
                      super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (ppAVar5 ==
                (this->node_stack_).c.
                super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
              _M_push_back_aux<alex::AlexNode<int,int>*const&>
                        ((deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *
                         )this_00,(AlexNode<int,_int> **)((long)dVar2 + lVar8));
            }
            else {
              *ppAVar5 = pAVar3;
              piVar1 = &(this->node_stack_).c.
                        super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
          }
          lVar8 = lVar8 + -8;
          lVar10 = lVar9 + -1;
          bVar4 = 0 < lVar9;
          lVar9 = lVar10;
        } while (lVar10 != 0 && bVar4);
      }
    }
    pAVar6 = this->cur_node_;
  }
  return pAVar6;
}

Assistant:

AlexNode<T, P>* next() {
      if (node_stack_.empty()) {
        cur_node_ = nullptr;
        return nullptr;
      }

      cur_node_ = node_stack_.top();
      node_stack_.pop();

      if (!cur_node_->is_leaf_) {
        auto node = static_cast<model_node_type*>(cur_node_);
        node_stack_.push(node->children_[node->num_children_ - 1]);
        for (int i = node->num_children_ - 2; i >= 0; i--) {
          if (node->children_[i] != node->children_[i + 1]) {
            node_stack_.push(node->children_[i]);
          }
        }
      }

      return cur_node_;
    }